

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::reserve_arena(Tree *this,size_t arena_cap)

{
  ulong in_RSI;
  long in_RDI;
  substr buf;
  Tree *in_stack_00000338;
  substr in_stack_00000340;
  basic_substring<char> local_20;
  ulong local_10;
  
  if (*(ulong *)(in_RDI + 0x30) < in_RSI) {
    local_10 = in_RSI;
    basic_substring<char>::basic_substring(&local_20);
    local_20.str = (char *)(**(code **)(in_RDI + 0x48))
                                     (local_10,*(undefined8 *)(in_RDI + 0x28),
                                      *(undefined8 *)(in_RDI + 0x40));
    local_20.len = local_10;
    if (*(long *)(in_RDI + 0x28) != 0) {
      _relocate(in_stack_00000338,in_stack_00000340);
      (**(code **)(in_RDI + 0x50))
                (*(undefined8 *)(in_RDI + 0x28),*(undefined8 *)(in_RDI + 0x30),
                 *(undefined8 *)(in_RDI + 0x40));
    }
    *(char **)(in_RDI + 0x28) = local_20.str;
    *(size_t *)(in_RDI + 0x30) = local_20.len;
  }
  return;
}

Assistant:

void reserve_arena(size_t arena_cap)
    {
        if(arena_cap > m_arena.len)
        {
            substr buf;
            buf.str = (char*) m_callbacks.m_allocate(arena_cap, m_arena.str, m_callbacks.m_user_data);
            buf.len = arena_cap;
            if(m_arena.str)
            {
                RYML_ASSERT(m_arena.len >= 0);
                _relocate(buf); // does a memcpy and changes nodes using the arena
                m_callbacks.m_free(m_arena.str, m_arena.len, m_callbacks.m_user_data);
            }
            m_arena = buf;
        }
    }